

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classical_ising_polynomial.hpp
# Opt level: O2

void __thiscall
openjij::system::ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_>::SetAdj
          (ClassicalIsingPolynomial<openjij::graph::Polynomial<double>_> *this)

{
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_00;
  pointer pvVar1;
  pointer puVar2;
  int64_t i;
  unsigned_long uVar3;
  unsigned_long *index;
  pointer puVar4;
  unsigned_long local_38;
  
  this_00 = &this->adj_;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear(this_00);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize(this_00,this->num_variables);
  for (uVar3 = 0; (long)uVar3 < this->num_interactions_; uVar3 = uVar3 + 1) {
    pvVar1 = (this->poly_key_list_).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = *(pointer *)
              ((long)&pvVar1[uVar3].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data + 8);
    for (puVar4 = pvVar1[uVar3].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
      local_38 = uVar3;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((this_00->
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + *puVar4,&local_38);
    }
  }
  return;
}

Assistant:

void SetAdj() {
    adj_.clear();
    adj_.resize(num_variables);
    for (int64_t i = 0; i < num_interactions_; ++i) {
      for (const auto &index : poly_key_list_[i]) {
        adj_[index].push_back(i);
      }
    }
  }